

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O0

void __thiscall GusteauChapter3UI::Run(GusteauChapter3UI *this,ApplicationContextBase *ac)

{
  bool bVar1;
  char *text;
  reference pvVar2;
  long in_RSI;
  double dVar3;
  char buff_1 [256];
  int i;
  size_t sz;
  int id;
  float v;
  ApplicationContext *app;
  ImVec2 *in_stack_fffffffffffffe58;
  Journal *in_stack_fffffffffffffe60;
  char *__s;
  float *data;
  Journal *in_stack_fffffffffffffe70;
  void *in_stack_fffffffffffffe78;
  TypedData *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  ImGuiInputTextFlags in_stack_fffffffffffffe8c;
  size_t in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeb4;
  char *in_stack_fffffffffffffeb8;
  CSP *in_stack_fffffffffffffec0;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar4;
  char *in_stack_ffffffffffffff80;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44 [2];
  int local_30;
  float local_2c;
  ImVec2 local_28;
  ImVec2 local_20;
  long local_18;
  
  local_18 = in_RSI;
  ImGui::Text("Hello Chapter 3");
  ImVec2::ImVec2(&local_20,0.0,0.0);
  bVar1 = ImGui::Button((char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (bVar1) {
    csp_emit(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
  }
  ImGui::InputText(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   in_stack_fffffffffffffe8c,(ImGuiInputTextCallback)in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe78);
  ImVec2::ImVec2(&local_28,0.0,0.0);
  bVar1 = ImGui::Button((char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (bVar1) {
    dVar3 = atof(Run::buff);
    local_2c = (float)dVar3;
    data = *(float **)(local_18 + 0x70);
    in_stack_fffffffffffffe70 = (Journal *)operator_new(0x18);
    Data<float>::Data((Data<float> *)in_stack_fffffffffffffe70,data);
    local_30 = blackboard_new_entry
                         ((Blackboard *)
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                          in_stack_fffffffffffffe80);
    csp_emit(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
  }
  ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                  SUB84(in_stack_fffffffffffffe60,0));
  ImVec2::ImVec2(local_44,0.0,0.0);
  bVar1 = ImGui::Button((char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (bVar1) {
    csp_emit(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
  }
  ImVec2::ImVec2(&local_4c,0.0,0.0);
  bVar1 = ImGui::Button((char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (bVar1) {
    csp_emit(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
  }
  ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                  SUB84(in_stack_fffffffffffffe60,0));
  ImVec2::ImVec2(&local_54,0.0,0.0);
  bVar1 = ImGui::Button((char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (bVar1) {
    csp_emit(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
  }
  ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                  SUB84(in_stack_fffffffffffffe60,0));
  ImVec2::ImVec2(&local_5c,0.0,0.0);
  bVar1 = ImGui::Button((char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (bVar1) {
    csp_emit(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
  }
  ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                  SUB84(in_stack_fffffffffffffe60,0));
  ImVec2::ImVec2(&local_64,0.0,0.0);
  bVar1 = ImGui::Button((char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (bVar1) {
    csp_emit(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
  }
  ImVec2::ImVec2(&local_6c,0.0,0.0);
  bVar1 = ImGui::Button((char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (bVar1) {
    Journal::undo(in_stack_fffffffffffffe70);
  }
  ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                  SUB84(in_stack_fffffffffffffe60,0));
  ImVec2::ImVec2(&local_74,0.0,0.0);
  bVar1 = ImGui::Button((char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (bVar1) {
    Journal::redo(in_stack_fffffffffffffe60);
  }
  ImGui::TextUnformatted
            (in_stack_ffffffffffffff80,
             (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  text = (char *)std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)(local_18 + 0x50));
  for (iVar4 = 0; (char *)(long)iVar4 < text; iVar4 = iVar4 + 1) {
    __s = &stack0xfffffffffffffe78;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_18 + 0x50),(long)iVar4);
    sprintf(__s,"%f",(double)*pvVar2);
    ImGui::TextUnformatted(text,(char *)CONCAT44(iVar4,in_stack_ffffffffffffff78));
  }
  return;
}

Assistant:

virtual void Run(ApplicationContextBase& ac) override
    {
        auto app = reinterpret_cast<ApplicationContext*>(&ac);

        ImGui::Text("Hello Chapter 3");
        if (ImGui::Button("Quit"))
        {
            csp_emit(app->csp, "quit", 0);
        }


        static char buff[256];
        ImGui::InputText("###value", buff, sizeof(buff));
        if (ImGui::Button("Push"))
        {
            float v = static_cast<float>(atof(buff));
            int id = blackboard_new_entry(app->blackboard, new Data<float>(v));
            csp_emit(app->csp, "push_value", id);
        }
        ImGui::SameLine();
        if (ImGui::Button("Pop"))
            csp_emit(app->csp, "pop_value", 0);

        if (ImGui::Button("+"))
            csp_emit(app->csp, "add", 0);
        ImGui::SameLine();
        if (ImGui::Button("-"))
            csp_emit(app->csp, "subtract", 0);
        ImGui::SameLine();
        if (ImGui::Button("*"))
            csp_emit(app->csp, "multiply", 0);
        ImGui::SameLine();
        if (ImGui::Button("/"))
            csp_emit(app->csp, "divide", 0);

        if (ImGui::Button("Undo"))
        {
            app->journal.undo();
        }
        ImGui::SameLine();
        if (ImGui::Button("Redo"))
        {
            app->journal.redo();
        }

        ImGui::TextUnformatted("------ STACK ------");
        size_t sz = app->value_stack.size();
        for (auto i = 0; i < sz; ++i)
        {
            char buff[256];
            sprintf(buff, "%f", app->value_stack[i]);
            ImGui::TextUnformatted(buff);
        }
    }